

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringprintf.cc
# Opt level: O0

void StringAppendV(string *dst,char *format,__va_list_tag *ap)

{
  char *__s;
  undefined8 *in_RDX;
  char *in_RSI;
  char *in_RDI;
  ulong uVar1;
  char *buf;
  int length;
  int result;
  va_list backup_ap;
  char space [1024];
  int local_440;
  uint local_43c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  char local_418 [1024];
  undefined8 *local_18;
  char *local_10;
  char *local_8;
  
  local_428 = in_RDX[2];
  local_438 = *in_RDX;
  uStack_430 = in_RDX[1];
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_43c = vsnprintf(local_418,0x400,in_RSI,&local_438);
  if (((int)local_43c < 0) || (0x3ff < local_43c)) {
    local_440 = 0x400;
    while( true ) {
      if ((int)local_43c < 0) {
        local_440 = local_440 << 1;
      }
      else {
        local_440 = local_43c + 1;
      }
      uVar1 = (ulong)local_440;
      if ((long)uVar1 < 0) {
        uVar1 = 0xffffffffffffffff;
      }
      __s = (char *)operator_new__(uVar1);
      local_428 = local_18[2];
      local_438 = *local_18;
      uStack_430 = local_18[1];
      local_43c = vsnprintf(__s,(long)local_440,local_10,&local_438);
      if ((-1 < (int)local_43c) && ((int)local_43c < local_440)) break;
      if (__s != (char *)0x0) {
        operator_delete__(__s);
      }
    }
    std::__cxx11::string::append(local_8,(ulong)__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
  }
  else {
    std::__cxx11::string::append(local_8,(ulong)local_418);
  }
  return;
}

Assistant:

static void StringAppendV(string* dst, const char* format, va_list ap) {
  // First try with a small fixed size buffer
  char space[1024];
  // It's possible for methods that use a va_list to invalidate
  // the data in it upon use.  The fix is to make a copy
  // of the structure before using it and use that copy instead.
  va_list backup_ap;
  va_copy(backup_ap, ap);
  int result = vsnprintf(space, sizeof(space), format, backup_ap);
  va_end(backup_ap);

  if ((result >= 0) && (result < sizeof(space))) {
    // It fit
    dst->append(space, result);
    return;
  }

  // Repeatedly increase buffer size until it fits
  int length = sizeof(space);
  while (true) {
    if (result < 0) {
      // Older behavior: just try doubling the buffer size
      length *= 2;
    } else {
      // We need exactly "result+1" characters
      length = result + 1;
    }
    char* buf = new char[length];

    // Restore the va_list before we use it again
    va_copy(backup_ap, ap);
    result = vsnprintf(buf, length, format, backup_ap);
    va_end(backup_ap);

    if ((result >= 0) && (result < length)) {
      // It fit
      dst->append(buf, result);
      delete[] buf;
      return;
    }
    delete[] buf;
  }
}